

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

int bitset_container_compute_cardinality(bitset_container_t *bitset)

{
  uint uVar1;
  uint64_t uVar2;
  bitset_container_t *in_RDI;
  int support;
  uint64_t in_stack_00000710;
  __m512i *in_stack_00000718;
  uint64_t in_stack_00000b10;
  __m256i *in_stack_00000b18;
  undefined4 local_4;
  
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 2) == 0) {
    if ((uVar1 & 1) == 0) {
      local_4 = _scalar_bitset_container_compute_cardinality(in_RDI);
    }
    else {
      uVar2 = avx2_harley_seal_popcount256(in_stack_00000b18,in_stack_00000b10);
      local_4 = (int)uVar2;
    }
  }
  else {
    uVar2 = avx512_vpopcount(in_stack_00000718,in_stack_00000710);
    local_4 = (int)uVar2;
  }
  return local_4;
}

Assistant:

int bitset_container_compute_cardinality(const bitset_container_t *bitset) {
    int support = croaring_hardware_support();
#if CROARING_COMPILER_SUPPORTS_AVX512
    if (support & ROARING_SUPPORTS_AVX512) {
        return (int)avx512_vpopcount(
            (const __m512i *)bitset->words,
            BITSET_CONTAINER_SIZE_IN_WORDS / (WORDS_IN_AVX512_REG));
    } else
#endif  // CROARING_COMPILER_SUPPORTS_AVX512
        if (support & ROARING_SUPPORTS_AVX2) {
            return (int)avx2_harley_seal_popcount256(
                (const __m256i *)bitset->words,
                BITSET_CONTAINER_SIZE_IN_WORDS / (CROARING_WORDS_IN_AVX2_REG));
        } else {
            return _scalar_bitset_container_compute_cardinality(bitset);
        }
}